

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitDestructuredArrayCore
               (ParseNode *list,RegSlot iteratorLocation,RegSlot nextMethodReg,
               RegSlot shouldCallReturnFunctionLocation,
               RegSlot shouldCallReturnFunctionLocationFinally,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  RegSlot resultReg;
  RegSlot resultReg_00;
  ByteCodeLabel BVar4;
  RegSlot resultReg_01;
  ByteCodeLabel BVar5;
  RegSlot R0;
  undefined4 *puVar6;
  ParseNodeBin *pPVar7;
  ParseNodeVar *pPVar8;
  ByteCodeWriter *pBVar9;
  bool local_61;
  ByteCodeLabel loadIter;
  ByteCodeLabel skipDefault;
  RegSlot valueLocationTmp;
  ByteCodeLabel beforeDefaultAssign;
  RegSlot valueLocation;
  ByteCodeLabel iteratorAlreadyDone;
  RegSlot doneLocation;
  RegSlot itemLocation;
  bool isAssignmentTarget;
  ParseNode *init;
  ParseNode *elem;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot shouldCallReturnFunctionLocationFinally_local;
  RegSlot shouldCallReturnFunctionLocation_local;
  RegSlot nextMethodReg_local;
  RegSlot iteratorLocation_local;
  ParseNode *list_local;
  
  if (list == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1924,"(list != nullptr)","list != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  init = (ParseNode *)0x0;
  _nextMethodReg_local = list;
LAB_00b4708d:
  do {
    if (_nextMethodReg_local == (ParseNode *)0x0) {
LAB_00b476a6:
      if ((init != (ParseNode *)0x0) && (init->nop == knopEllipsis)) {
        EmitDestructuredRestArray
                  (init,iteratorLocation,nextMethodReg,shouldCallReturnFunctionLocation,
                   shouldCallReturnFunctionLocationFinally,byteCodeGenerator,funcInfo);
      }
      return;
    }
    _itemLocation = (ParseNode *)0x0;
    if (_nextMethodReg_local->nop == knopList) {
      pPVar7 = ParseNode::AsParseNodeBin(_nextMethodReg_local);
      init = pPVar7->pnode1;
    }
    else {
      init = _nextMethodReg_local;
    }
    if (init->nop == knopEllipsis) goto LAB_00b476a6;
    if (init->nop == 0x31) {
      pPVar7 = ParseNode::AsParseNodeBin(init);
      _itemLocation = pPVar7->pnode2;
      pPVar7 = ParseNode::AsParseNodeBin(init);
      init = pPVar7->pnode1;
    }
    else if (init->nop - 0x51 < 3) {
      pPVar8 = ParseNode::AsParseNodeVar(init);
      _itemLocation = pPVar8->pnodeInit;
    }
    ByteCodeGenerator::StartStatement(byteCodeGenerator,init);
    bVar2 = ParseNode::IsPattern(init);
    local_61 = true;
    if (!bVar2) {
      local_61 = ParseNode::IsVarLetOrConst(init);
    }
    bVar2 = (bool)((local_61 ^ 0xffU) & 1);
    if (bVar2 != false) {
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Reg1(pBVar9,LdTrue_ReuseLoc,shouldCallReturnFunctionLocation);
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Reg1(pBVar9,LdTrue_ReuseLoc,shouldCallReturnFunctionLocationFinally);
      EmitReference(init,byteCodeGenerator,funcInfo);
    }
    pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar9,LdFalse_ReuseLoc,shouldCallReturnFunctionLocation);
    pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar9,LdFalse_ReuseLoc,shouldCallReturnFunctionLocationFinally);
    resultReg = FuncInfo::AcquireTmpRegister(funcInfo);
    EmitFunctionCall(resultReg,nextMethodReg,iteratorLocation,byteCodeGenerator,funcInfo);
    EmitThrowOnNotObject(resultReg,byteCodeGenerator);
    resultReg_00 = FuncInfo::AcquireTmpRegister(funcInfo);
    EmitGetObjectProperty(resultReg_00,resultReg,0x74,byteCodeGenerator,funcInfo);
    if (init->nop != knopEmpty) {
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      BVar4 = Js::ByteCodeWriter::DefineLabel(pBVar9);
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::BrReg1(pBVar9,BrTrue_A,BVar4,resultReg_00);
      resultReg_01 = FuncInfo::AcquireTmpRegister(funcInfo);
      EmitGetObjectProperty(resultReg_01,resultReg,0x197,byteCodeGenerator,funcInfo);
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      BVar5 = Js::ByteCodeWriter::DefineLabel(pBVar9);
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Reg1(pBVar9,LdTrue_ReuseLoc,shouldCallReturnFunctionLocation);
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Reg1(pBVar9,LdTrue_ReuseLoc,shouldCallReturnFunctionLocationFinally);
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Br(pBVar9,BVar5);
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::MarkLabel(pBVar9,BVar4);
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Reg2
                (pBVar9,Ld_A_ReuseLoc,resultReg_01,funcInfo->undefinedConstantRegister);
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::MarkLabel(pBVar9,BVar5);
      bVar3 = ParseNode::IsPattern(init);
      if (bVar3) {
        if (_itemLocation == (ParseNode *)0x0) {
          if (init->nop == knopObjectPattern) {
            EmitDestructuredObject(init,resultReg_01,byteCodeGenerator,funcInfo);
          }
          else {
            EmitDestructuredArray(init,resultReg_01,byteCodeGenerator,funcInfo);
          }
        }
        else {
          R0 = FuncInfo::AcquireTmpRegister(funcInfo);
          ByteCodeGenerator::StartStatement(byteCodeGenerator,_itemLocation);
          pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
          BVar4 = Js::ByteCodeWriter::DefineLabel(pBVar9);
          pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
          BVar5 = Js::ByteCodeWriter::DefineLabel(pBVar9);
          pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::BrReg2
                    (pBVar9,BrSrNeq_A,BVar4,resultReg_01,funcInfo->undefinedConstantRegister);
          Emit(_itemLocation,byteCodeGenerator,funcInfo,0,false,false);
          pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::Reg2(pBVar9,Ld_A,R0,_itemLocation->location);
          FuncInfo::ReleaseLoc(funcInfo,_itemLocation);
          pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::Br(pBVar9,BVar5);
          pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::MarkLabel(pBVar9,BVar4);
          pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::Reg2(pBVar9,Ld_A_ReuseLoc,R0,resultReg_01);
          pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::MarkLabel(pBVar9,BVar5);
          ByteCodeGenerator::EndStatement(byteCodeGenerator,_itemLocation);
          if (init->nop == knopObjectPattern) {
            EmitDestructuredObject(init,R0,byteCodeGenerator,funcInfo);
          }
          else {
            EmitDestructuredArray(init,R0,byteCodeGenerator,funcInfo);
          }
          FuncInfo::ReleaseTmpRegister(funcInfo,R0);
        }
      }
      else {
        EmitDestructuredValueOrInitializer
                  (init,resultReg_01,_itemLocation,bVar2,byteCodeGenerator,funcInfo);
      }
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Reg1(pBVar9,LdFalse_ReuseLoc,shouldCallReturnFunctionLocation);
      pBVar9 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Reg1(pBVar9,LdFalse_ReuseLoc,shouldCallReturnFunctionLocationFinally);
      if (_nextMethodReg_local->nop != knopList) {
        EmitIteratorCloseIfNotDone(iteratorLocation,resultReg_00,byteCodeGenerator,funcInfo);
      }
      FuncInfo::ReleaseTmpRegister(funcInfo,resultReg_01);
      FuncInfo::ReleaseTmpRegister(funcInfo,resultReg_00);
      FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
      if (bVar2 != false) {
        FuncInfo::ReleaseReference(funcInfo,init);
      }
      ByteCodeGenerator::EndStatement(byteCodeGenerator,init);
      if (_nextMethodReg_local->nop != knopList) goto LAB_00b476a6;
      pPVar7 = ParseNode::AsParseNodeBin(_nextMethodReg_local);
      _nextMethodReg_local = pPVar7->pnode2;
      goto LAB_00b4708d;
    }
    if (_nextMethodReg_local->nop != knopList) {
      if (_nextMethodReg_local->nop != knopEmpty) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1976,"(list->nop == knopEmpty)","list->nop == knopEmpty");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      EmitIteratorCloseIfNotDone(iteratorLocation,resultReg_00,byteCodeGenerator,funcInfo);
      FuncInfo::ReleaseTmpRegister(funcInfo,resultReg_00);
      FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
      goto LAB_00b476a6;
    }
    pPVar7 = ParseNode::AsParseNodeBin(_nextMethodReg_local);
    _nextMethodReg_local = pPVar7->pnode2;
    FuncInfo::ReleaseTmpRegister(funcInfo,resultReg_00);
    FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
  } while( true );
}

Assistant:

void EmitDestructuredArrayCore(
    ParseNode* list,
    Js::RegSlot iteratorLocation,
    Js::RegSlot nextMethodReg,
    Js::RegSlot shouldCallReturnFunctionLocation,
    Js::RegSlot shouldCallReturnFunctionLocationFinally,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    Assert(list != nullptr);

    ParseNode *elem = nullptr;
    while (list != nullptr)
    {
        ParseNode *init = nullptr;

        if (list->nop == knopList)
        {
            elem = list->AsParseNodeBin()->pnode1;
        }
        else
        {
            elem = list;
        }

        if (elem->nop == knopEllipsis)
        {
            break;
        }

        switch (elem->nop)
        {
        case knopAsg:
            // An assignment node will always have an initializer
            init = elem->AsParseNodeBin()->pnode2;
            elem = elem->AsParseNodeBin()->pnode1;
            break;

        case knopVarDecl:
        case knopLetDecl:
        case knopConstDecl:
            init = elem->AsParseNodeVar()->pnodeInit;
            break;

        default:
            break;
        }

        byteCodeGenerator->StartStatement(elem);

        bool isAssignmentTarget = !(elem->IsPattern() || elem->IsVarLetOrConst());

        if (isAssignmentTarget)
        {
            byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocation);
            byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocationFinally);
            EmitReference(elem, byteCodeGenerator, funcInfo);
        }

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocationFinally);

        Js::RegSlot itemLocation = funcInfo->AcquireTmpRegister();
        EmitFunctionCall(
            itemLocation,
            nextMethodReg,
            iteratorLocation,
            byteCodeGenerator,
            funcInfo);

        EmitThrowOnNotObject(itemLocation, byteCodeGenerator);

        Js::RegSlot doneLocation = funcInfo->AcquireTmpRegister();
        EmitGetObjectProperty(
            doneLocation,
            itemLocation,
            Js::PropertyIds::done,
            byteCodeGenerator,
            funcInfo);

        if (elem->nop == knopEmpty)
        {
            if (list->nop == knopList)
            {
                list = list->AsParseNodeBin()->pnode2;
                funcInfo->ReleaseTmpRegister(doneLocation);
                funcInfo->ReleaseTmpRegister(itemLocation);
                continue;
            }
            else
            {
                Assert(list->nop == knopEmpty);
                EmitIteratorCloseIfNotDone(iteratorLocation, doneLocation, byteCodeGenerator, funcInfo);
                funcInfo->ReleaseTmpRegister(doneLocation);
                funcInfo->ReleaseTmpRegister(itemLocation);
                break;
            }
        }

        // If the iterator hasn't completed, skip assigning undefined.
        Js::ByteCodeLabel iteratorAlreadyDone = byteCodeGenerator->Writer()->DefineLabel();
        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, iteratorAlreadyDone, doneLocation);

        // We're not done with the iterator, so assign the .next() value.
        Js::RegSlot valueLocation = funcInfo->AcquireTmpRegister();
        EmitGetObjectProperty(
            valueLocation,
            itemLocation,
            Js::PropertyIds::value,
            byteCodeGenerator,
            funcInfo);

        Js::ByteCodeLabel beforeDefaultAssign = byteCodeGenerator->Writer()->DefineLabel();

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocationFinally);
        byteCodeGenerator->Writer()->Br(beforeDefaultAssign);

        // iteratorAlreadyDone:
        byteCodeGenerator->Writer()->MarkLabel(iteratorAlreadyDone);
        byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, valueLocation, funcInfo->undefinedConstantRegister);

        // beforeDefaultAssign:
        byteCodeGenerator->Writer()->MarkLabel(beforeDefaultAssign);

        if (elem->IsPattern())
        {
            // If we get an undefined value and have an initializer, use it in place of undefined.
            if (init != nullptr)
            {
                /*
                the IR builder uses two symbols for a temp register in the if else path
                R9 <- R3
                if (...)
                R9 <- R2
                R10 = R9.<property>  // error -> IR creates a new lifetime for the if path, and the direct path dest is not referenced
                hence we have to create a new temp

                TEMP REG USED TO FIX THIS PRODUCES THIS
                R9 <- R3
                if (BrEq_A R9, R3)
                R10 <- R2               :
                else
                R10 <- R9               : skipdefault
                ...  = R10[@@iterator]  : loadIter
                */

                // Temp Register
                Js::RegSlot valueLocationTmp = funcInfo->AcquireTmpRegister();
                byteCodeGenerator->StartStatement(init);

                Js::ByteCodeLabel skipDefault = byteCodeGenerator->Writer()->DefineLabel();
                Js::ByteCodeLabel loadIter = byteCodeGenerator->Writer()->DefineLabel();

                // check value is undefined
                byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrSrNeq_A, skipDefault, valueLocation, funcInfo->undefinedConstantRegister);

                // Evaluate the default expression and assign it.
                Emit(init, byteCodeGenerator, funcInfo, false);
                byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, valueLocationTmp, init->location);
                funcInfo->ReleaseLoc(init);

                // jmp to loadIter
                byteCodeGenerator->Writer()->Br(loadIter);

                // skipDefault:
                byteCodeGenerator->Writer()->MarkLabel(skipDefault);
                byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, valueLocationTmp, valueLocation);

                // loadIter:
                // @@iterator
                byteCodeGenerator->Writer()->MarkLabel(loadIter);
                byteCodeGenerator->EndStatement(init);

                if (elem->nop == knopObjectPattern)
                {
                    EmitDestructuredObject(elem, valueLocationTmp, byteCodeGenerator, funcInfo);
                }
                else
                {
                    // Recursively emit a destructured array using the current .next() as the RHS.
                    EmitDestructuredArray(elem, valueLocationTmp, byteCodeGenerator, funcInfo);
                }

                funcInfo->ReleaseTmpRegister(valueLocationTmp);
            }
            else
            {
                if (elem->nop == knopObjectPattern)
                {
                    EmitDestructuredObject(elem, valueLocation, byteCodeGenerator, funcInfo);
                }
                else
                {
                    // Recursively emit a destructured array using the current .next() as the RHS.
                    EmitDestructuredArray(elem, valueLocation, byteCodeGenerator, funcInfo);
                }
            }
        }
        else
        {
            EmitDestructuredValueOrInitializer(elem, valueLocation, init, isAssignmentTarget, byteCodeGenerator, funcInfo);
        }

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocationFinally);

        if (list->nop != knopList)
        {
            EmitIteratorCloseIfNotDone(iteratorLocation, doneLocation, byteCodeGenerator, funcInfo);
        }

        funcInfo->ReleaseTmpRegister(valueLocation);
        funcInfo->ReleaseTmpRegister(doneLocation);
        funcInfo->ReleaseTmpRegister(itemLocation);

        if (isAssignmentTarget)
        {
            funcInfo->ReleaseReference(elem);
        }

        byteCodeGenerator->EndStatement(elem);

        if (list->nop == knopList)
        {
            list = list->AsParseNodeBin()->pnode2;
        }
        else
        {
            break;
        }
    }

    // If we saw a rest element, emit the rest array.
    if (elem != nullptr && elem->nop == knopEllipsis)
    {
        EmitDestructuredRestArray(
            elem,
            iteratorLocation,
            nextMethodReg,
            shouldCallReturnFunctionLocation,
            shouldCallReturnFunctionLocationFinally,
            byteCodeGenerator,
            funcInfo);
    }
}